

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

void bmGateWay(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int p_equivalence)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  char *vPiValues;
  char *vPiValues_00;
  int *observability;
  int *observability_00;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool local_149;
  int temp;
  int ioSuccess2;
  int ioSuccess1;
  int counter;
  int oNumOfItemsAdded;
  int iNumOfItemsAdded;
  Vec_Ptr_t **topOrder2;
  Vec_Ptr_t **topOrder1;
  float satTime;
  float simulTime;
  float initTime;
  abctime clk;
  int *observability2;
  int *observability1;
  char *vPiValues2;
  char *vPiValues1;
  int j;
  int i;
  int oLastItem2;
  int iLastItem2;
  int oLastItem1;
  int iLastItem1;
  int *oGroup2;
  int *iGroup2;
  int *oGroup1;
  int *iGroup1;
  Vec_Int_t **oMatch2;
  Vec_Int_t **iMatch2;
  Vec_Int_t **oMatch1;
  Vec_Int_t **iMatch1;
  Vec_Int_t **oDep2;
  Vec_Int_t **iDep2;
  Vec_Int_t **oDep1;
  Vec_Int_t **iDep1;
  Abc_Ntk_t *pAStack_40;
  int p_equivalence_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  iDep1._4_4_ = p_equivalence;
  pAStack_40 = pNtk2;
  pNtk2_local = pNtk1;
  aVar5 = Abc_Clock();
  topOrder2 = (Vec_Ptr_t **)0x0;
  _oNumOfItemsAdded = (Vec_Ptr_t **)0x0;
  uVar2 = Abc_NtkPiNum(pNtk2_local);
  oDep1 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPoNum(pNtk2_local);
  iDep2 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPiNum(pAStack_40);
  oDep2 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPoNum(pAStack_40);
  iMatch1 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPiNum(pNtk2_local);
  oMatch1 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPoNum(pNtk2_local);
  iMatch2 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPiNum(pAStack_40);
  oMatch2 = (Vec_Int_t **)malloc((ulong)uVar2 << 3);
  uVar2 = Abc_NtkPoNum(pAStack_40);
  iGroup1 = (int *)malloc((ulong)uVar2 << 3);
  iVar3 = Abc_NtkPiNum(pNtk2_local);
  oGroup1 = (int *)malloc((long)iVar3 << 2);
  iVar3 = Abc_NtkPoNum(pNtk2_local);
  iGroup2 = (int *)malloc((long)iVar3 << 2);
  iVar3 = Abc_NtkPiNum(pAStack_40);
  oGroup2 = (int *)malloc((long)iVar3 << 2);
  iVar3 = Abc_NtkPoNum(pAStack_40);
  _oLastItem1 = (int *)malloc((long)iVar3 << 2);
  iVar3 = Abc_NtkPiNum(pNtk2_local);
  vPiValues = (char *)malloc((long)(iVar3 + 1));
  iVar3 = Abc_NtkPiNum(pNtk2_local);
  vPiValues[iVar3] = '\0';
  iVar3 = Abc_NtkPiNum(pAStack_40);
  vPiValues_00 = (char *)malloc((long)(iVar3 + 1));
  iVar3 = Abc_NtkPiNum(pAStack_40);
  vPiValues_00[iVar3] = '\0';
  uVar2 = Abc_NtkPiNum(pNtk2_local);
  observability = (int *)malloc((ulong)uVar2 << 2);
  uVar2 = Abc_NtkPiNum(pAStack_40);
  observability_00 = (int *)malloc((ulong)uVar2 << 2);
  for (vPiValues1._4_4_ = 0; iVar3 = Abc_NtkPiNum(pNtk2_local), vPiValues1._4_4_ < iVar3;
      vPiValues1._4_4_ = vPiValues1._4_4_ + 1) {
    pVVar6 = Vec_IntAlloc(1);
    oDep1[vPiValues1._4_4_] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    oMatch1[vPiValues1._4_4_] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    oDep2[vPiValues1._4_4_] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    oMatch2[vPiValues1._4_4_] = pVVar6;
    vPiValues[vPiValues1._4_4_] = '0';
    vPiValues_00[vPiValues1._4_4_] = '0';
    observability[vPiValues1._4_4_] = 0;
    observability_00[vPiValues1._4_4_] = 0;
  }
  for (vPiValues1._4_4_ = 0; iVar3 = Abc_NtkPoNum(pNtk2_local), vPiValues1._4_4_ < iVar3;
      vPiValues1._4_4_ = vPiValues1._4_4_ + 1) {
    pVVar6 = Vec_IntAlloc(1);
    iDep2[vPiValues1._4_4_] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    iMatch2[vPiValues1._4_4_] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    iMatch1[vPiValues1._4_4_] = pVVar6;
    pVVar6 = Vec_IntAlloc(1);
    *(Vec_Int_t **)(iGroup1 + (long)vPiValues1._4_4_ * 2) = pVVar6;
  }
  pNtk2_local = Abc_NtkStrash(pNtk2_local,0,0,0);
  pAStack_40 = Abc_NtkStrash(pAStack_40,0,0,0);
  printf("Network  strashing is done!\n");
  getDependencies(pNtk2_local,oDep1,iDep2);
  getDependencies(pAStack_40,oDep2,iMatch1);
  printf("Getting dependencies is done!\n");
  initMatchList(pNtk2_local,oDep1,iDep2,oMatch1,&iLastItem2,iMatch2,&oLastItem2,oGroup1,iGroup2,
                iDep1._4_4_);
  initMatchList(pAStack_40,oDep2,iMatch1,oMatch2,&i,(Vec_Int_t **)iGroup1,&j,oGroup2,_oLastItem1,
                iDep1._4_4_);
  printf("Initializing match lists is done!\n");
  iVar3 = checkListConsistency
                    (oMatch1,iMatch2,oMatch2,(Vec_Int_t **)iGroup1,iLastItem2,oLastItem2,i,j);
  if (iVar3 == 0) {
    fprintf(_stdout,"I/O dependencies of two circuits are different.\n");
  }
  else {
    printf("Refining IOs by dependencies ...");
    counter = 1;
    ioSuccess1 = 1;
    do {
      if (ioSuccess1 != 0) {
        iSortDependencies(pNtk2_local,oDep1,iGroup2);
        iSortDependencies(pAStack_40,oDep2,_oLastItem1);
      }
      if (counter != 0) {
        oSortDependencies(pNtk2_local,iDep2,oGroup1);
        oSortDependencies(pAStack_40,iMatch1,oGroup2);
      }
      iVar3 = iLastItem2;
      iVar4 = Abc_NtkPiNum(pNtk2_local);
      if (iVar3 < iVar4) {
        iSplitByDep(pNtk2_local,oDep1,oMatch1,oGroup1,&iLastItem2,iGroup2);
        iVar3 = oLastItem2;
        iVar4 = Abc_NtkPoNum(pNtk2_local);
        if (iVar3 < iVar4) {
          oSplitByDep(pNtk2_local,iDep2,iMatch2,iGroup2,&oLastItem2,oGroup1);
        }
      }
      iVar3 = i;
      iVar4 = Abc_NtkPiNum(pAStack_40);
      if (iVar3 < iVar4) {
        counter = iSplitByDep(pAStack_40,oDep2,oMatch2,oGroup2,&i,_oLastItem1);
      }
      else {
        counter = 0;
      }
      iVar3 = j;
      iVar4 = Abc_NtkPoNum(pAStack_40);
      if (iVar3 < iVar4) {
        ioSuccess1 = oSplitByDep(pAStack_40,iMatch1,(Vec_Int_t **)iGroup1,_oLastItem1,&j,oGroup2);
      }
      else {
        ioSuccess1 = 0;
      }
      iVar3 = checkListConsistency
                        (oMatch1,iMatch2,oMatch2,(Vec_Int_t **)iGroup1,iLastItem2,oLastItem2,i,j);
      if (iVar3 == 0) {
        fprintf(_stdout,"I/O dependencies of two circuits are different.\n");
        goto LAB_002d7df2;
      }
      local_149 = counter != 0 || ioSuccess1 != 0;
    } while (local_149);
    printf(" done!\n");
    aVar7 = Abc_Clock();
    fVar8 = (float)(aVar7 - aVar5) / 1e+06;
    aVar5 = Abc_Clock();
    topOrder2 = findTopologicalOrder(pNtk2_local);
    _oNumOfItemsAdded = findTopologicalOrder(pAStack_40);
    printf("Refining IOs by simulation ...");
    ioSuccess2 = 0;
    do {
      for (vPiValues1._4_4_ = 0; vPiValues1._4_4_ < iLastItem2;
          vPiValues1._4_4_ = vPiValues1._4_4_ + 1) {
        rand();
        rand();
        iVar3 = rand();
        bVar1 = (byte)iVar3 & 1;
        iVar3 = Vec_IntSize(oMatch1[vPiValues1._4_4_]);
        iVar4 = Vec_IntSize(oMatch2[vPiValues1._4_4_]);
        if (iVar3 != iVar4) {
          fprintf(_stdout,"Input refinement by simulation finds two circuits different.\n");
          goto LAB_002d7df2;
        }
        for (vPiValues1._0_4_ = 0; iVar3 = Vec_IntSize(oMatch1[vPiValues1._4_4_]),
            (int)vPiValues1 < iVar3; vPiValues1._0_4_ = (int)vPiValues1 + 1) {
          iVar3 = Vec_IntEntry(oMatch1[vPiValues1._4_4_],(int)vPiValues1);
          vPiValues[iVar3] = bVar1 + 0x30;
          iVar3 = Vec_IntEntry(oMatch2[vPiValues1._4_4_],(int)vPiValues1);
          vPiValues_00[iVar3] = bVar1 + 0x30;
        }
      }
      iVar3 = refineIOBySimulation
                        (pNtk2_local,oMatch1,&iLastItem2,oGroup1,oDep1,iMatch2,&oLastItem2,iGroup2,
                         iDep2,vPiValues,observability,topOrder2);
      iVar4 = refineIOBySimulation
                        (pAStack_40,oMatch2,&i,oGroup2,oDep2,(Vec_Int_t **)iGroup1,&j,_oLastItem1,
                         iMatch1,vPiValues_00,observability_00,_oNumOfItemsAdded);
      if ((iVar3 == 0) || (iVar4 == 0)) {
        ioSuccess2 = ioSuccess2 + 1;
      }
      else {
        ioSuccess2 = 0;
      }
      if ((iVar3 != iVar4) ||
         (iVar3 = checkListConsistency
                            (oMatch1,iMatch2,oMatch2,(Vec_Int_t **)iGroup1,iLastItem2,oLastItem2,i,j
                            ), iVar3 == 0)) {
        fprintf(_stdout,"Input refinement by simulation finds two circuits different.\n");
        goto LAB_002d7df2;
      }
    } while (ioSuccess2 < 0xc9);
    printf(" done!\n");
    aVar7 = Abc_Clock();
    fVar9 = (float)(aVar7 - aVar5) / 1e+06;
    printf("SAT-based search started ...\n");
    fVar10 = refineBySAT(pNtk2_local,oMatch1,oGroup1,oDep1,&iLastItem2,iMatch2,iGroup2,iDep2,
                         &oLastItem2,observability,pAStack_40,oMatch2,oGroup2,oDep2,&i,
                         (Vec_Int_t **)iGroup1,_oLastItem1,iMatch1,&j,observability_00);
    printf("Init Time = %4.2f\n",(double)fVar8);
    printf("Simulation Time = %4.2f\n",(double)fVar9);
    printf("SAT Time = %4.2f\n",(double)fVar10);
    printf("Overall Time = %4.2f\n",(double)(fVar8 + fVar9 + fVar10));
  }
LAB_002d7df2:
  for (vPiValues1._4_4_ = 0; vPiValues1._4_4_ < iLastItem2; vPiValues1._4_4_ = vPiValues1._4_4_ + 1)
  {
    Vec_IntFree(oMatch1[vPiValues1._4_4_]);
    Vec_IntFree(oMatch2[vPiValues1._4_4_]);
  }
  for (vPiValues1._4_4_ = 0; vPiValues1._4_4_ < oLastItem2; vPiValues1._4_4_ = vPiValues1._4_4_ + 1)
  {
    Vec_IntFree(iMatch2[vPiValues1._4_4_]);
    Vec_IntFree(*(Vec_Int_t **)(iGroup1 + (long)vPiValues1._4_4_ * 2));
  }
  for (vPiValues1._4_4_ = 0; iVar3 = Abc_NtkPiNum(pNtk2_local), vPiValues1._4_4_ < iVar3;
      vPiValues1._4_4_ = vPiValues1._4_4_ + 1) {
    Vec_IntFree(oDep1[vPiValues1._4_4_]);
    Vec_IntFree(oDep2[vPiValues1._4_4_]);
    if (topOrder2 != (Vec_Ptr_t **)0x0) {
      Vec_PtrFree(topOrder2[vPiValues1._4_4_]);
      Vec_PtrFree(_oNumOfItemsAdded[vPiValues1._4_4_]);
    }
  }
  for (vPiValues1._4_4_ = 0; iVar3 = Abc_NtkPoNum(pNtk2_local), vPiValues1._4_4_ < iVar3;
      vPiValues1._4_4_ = vPiValues1._4_4_ + 1) {
    Vec_IntFree(iDep2[vPiValues1._4_4_]);
    Vec_IntFree(iMatch1[vPiValues1._4_4_]);
  }
  if (oMatch1 != (Vec_Int_t **)0x0) {
    free(oMatch1);
    oMatch1 = (Vec_Int_t **)0x0;
  }
  if (oMatch2 != (Vec_Int_t **)0x0) {
    free(oMatch2);
    oMatch2 = (Vec_Int_t **)0x0;
  }
  if (iMatch2 != (Vec_Int_t **)0x0) {
    free(iMatch2);
    iMatch2 = (Vec_Int_t **)0x0;
  }
  if (iGroup1 != (int *)0x0) {
    free(iGroup1);
    iGroup1 = (int *)0x0;
  }
  if (oDep1 != (Vec_Int_t **)0x0) {
    free(oDep1);
    oDep1 = (Vec_Int_t **)0x0;
  }
  if (oDep2 != (Vec_Int_t **)0x0) {
    free(oDep2);
    oDep2 = (Vec_Int_t **)0x0;
  }
  if (iDep2 != (Vec_Int_t **)0x0) {
    free(iDep2);
    iDep2 = (Vec_Int_t **)0x0;
  }
  if (iMatch1 != (Vec_Int_t **)0x0) {
    free(iMatch1);
    iMatch1 = (Vec_Int_t **)0x0;
  }
  if (oGroup1 != (int *)0x0) {
    free(oGroup1);
    oGroup1 = (int *)0x0;
  }
  if (oGroup2 != (int *)0x0) {
    free(oGroup2);
    oGroup2 = (int *)0x0;
  }
  if (iGroup2 != (int *)0x0) {
    free(iGroup2);
    iGroup2 = (int *)0x0;
  }
  if (_oLastItem1 != (int *)0x0) {
    free(_oLastItem1);
    _oLastItem1 = (int *)0x0;
  }
  if (vPiValues != (char *)0x0) {
    free(vPiValues);
  }
  if (vPiValues_00 != (char *)0x0) {
    free(vPiValues_00);
  }
  if (observability != (int *)0x0) {
    free(observability);
  }
  if (observability_00 != (int *)0x0) {
    free(observability_00);
  }
  if (topOrder2 != (Vec_Ptr_t **)0x0) {
    if (topOrder2 != (Vec_Ptr_t **)0x0) {
      free(topOrder2);
    }
    if (_oNumOfItemsAdded != (Vec_Ptr_t **)0x0) {
      free(_oNumOfItemsAdded);
    }
  }
  return;
}

Assistant:

void bmGateWay( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int p_equivalence )
{    
    Vec_Int_t ** iDep1, ** oDep1;
    Vec_Int_t ** iDep2, ** oDep2;
    Vec_Int_t ** iMatch1, ** oMatch1;
    Vec_Int_t ** iMatch2, ** oMatch2;        
    int * iGroup1, * oGroup1;
    int * iGroup2, * oGroup2;
    int iLastItem1, oLastItem1;
    int iLastItem2, oLastItem2;    
    int i, j;    
    
    char * vPiValues1, * vPiValues2;
    int * observability1, * observability2;
    abctime clk = Abc_Clock();
    float initTime;
    float simulTime;
    float satTime;
    Vec_Ptr_t ** topOrder1 = NULL, ** topOrder2 = NULL;

    extern void getDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep);
    extern void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence);        
    extern void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup);
    extern void oSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, int* iGroup);
    extern int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup);
    extern int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup);    
    extern Vec_Ptr_t ** findTopologicalOrder(Abc_Ntk_t * pNtk);
    extern int refineIOBySimulation(Abc_Ntk_t *pNtk, Vec_Int_t** iMatch, int* iLastItem, int * iGroup, Vec_Int_t** iDep, Vec_Int_t** oMatch, int* oLastItem, int * oGroup, Vec_Int_t** oDep, char * vPiValues, int * observability, Vec_Ptr_t ** topOrder);    
    extern float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
                            Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2);                
    int checkListConsistency(Vec_Int_t ** iMatch1, Vec_Int_t ** oMatch1, Vec_Int_t ** iMatch2, Vec_Int_t ** oMatch2, int iLastItem1, int oLastItem1, int iLastItem2, int oLastItem2);    

    iDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
    oDep1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

    iDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
    oDep2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );

    iMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk1) );
    oMatch1 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk1) );

    iMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPiNum(pNtk2) );
    oMatch2 = ABC_ALLOC( Vec_Int_t*,  (unsigned)Abc_NtkPoNum(pNtk2) );        

    iGroup1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
    oGroup1 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk1) );

    iGroup2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );
    oGroup2 = ABC_ALLOC( int, Abc_NtkPoNum(pNtk2) );

    vPiValues1 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk1) + 1);
    vPiValues1[Abc_NtkPiNum(pNtk1)] = '\0';    

    vPiValues2 = ABC_ALLOC( char,  Abc_NtkPiNum(pNtk2) + 1);
    vPiValues2[Abc_NtkPiNum(pNtk2)] = '\0';    

    observability1 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk1));
    observability2 = ABC_ALLOC(int, (unsigned)Abc_NtkPiNum(pNtk2));

    for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
    {        
        iDep1[i] = Vec_IntAlloc( 1 );
        iMatch1[i] = Vec_IntAlloc( 1 );

        iDep2[i] = Vec_IntAlloc( 1 );
        iMatch2[i] = Vec_IntAlloc( 1 );

        vPiValues1[i] = '0';
        vPiValues2[i] = '0';

        observability1[i] = 0;
        observability2[i] = 0;
    }

    for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
    {
        oDep1[i] = Vec_IntAlloc( 1 );
        oMatch1[i] = Vec_IntAlloc( 1 );

        oDep2[i] = Vec_IntAlloc( 1 );
        oMatch2[i] = Vec_IntAlloc( 1 );
    }    
    
    /************* Strashing ************/    
    pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );    
    pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );            
    printf("Network  strashing is done!\n");    
    /************************************/    
    
    /******* Getting Dependencies *******/    
    getDependencies(pNtk1, iDep1, oDep1);
    getDependencies(pNtk2, iDep2, oDep2);            
    printf("Getting dependencies is done!\n");    
    /************************************/

    /***** Intializing match lists ******/    
    initMatchList(pNtk1, iDep1, oDep1, iMatch1, &iLastItem1, oMatch1, &oLastItem1, iGroup1, oGroup1, p_equivalence);            
    initMatchList(pNtk2, iDep2, oDep2, iMatch2, &iLastItem2, oMatch2, &oLastItem2, iGroup2, oGroup2, p_equivalence);    
    printf("Initializing match lists is done!\n");        
    /************************************/

    if( !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2) )
    {
        fprintf( stdout, "I/O dependencies of two circuits are different.\n");
        goto freeAndExit;
    }        

    printf("Refining IOs by dependencies ...");                
    // split match lists further by checking dependencies
    do
    {
        int iNumOfItemsAdded = 1, oNumOfItemsAdded = 1;        

        do
        {    
            if( oNumOfItemsAdded )
            {
                iSortDependencies(pNtk1, iDep1, oGroup1);
                iSortDependencies(pNtk2, iDep2, oGroup2);
            }
            
            if( iNumOfItemsAdded )
            {
                oSortDependencies(pNtk1, oDep1, iGroup1);
                oSortDependencies(pNtk2, oDep2, iGroup2);
            }

            if( iLastItem1 < Abc_NtkPiNum(pNtk1) )
            {                
                iSplitByDep(pNtk1, iDep1, iMatch1, iGroup1, &iLastItem1, oGroup1);
                if( oLastItem1 < Abc_NtkPoNum(pNtk1) )
                    oSplitByDep(pNtk1, oDep1, oMatch1, oGroup1, &oLastItem1, iGroup1);
            }                

            if( iLastItem2 < Abc_NtkPiNum(pNtk2) )
                iNumOfItemsAdded = iSplitByDep(pNtk2, iDep2, iMatch2, iGroup2, &iLastItem2, oGroup2);
            else
                iNumOfItemsAdded = 0;    
                
            if( oLastItem2 < Abc_NtkPoNum(pNtk2) )        
                oNumOfItemsAdded = oSplitByDep(pNtk2, oDep2, oMatch2, oGroup2, &oLastItem2, iGroup2);
            else
                oNumOfItemsAdded = 0;
            
            if(!checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
            {
                fprintf( stdout, "I/O dependencies of two circuits are different.\n");
                goto freeAndExit;
            }        
        }while(iNumOfItemsAdded != 0 || oNumOfItemsAdded != 0);

    }while(0);

    printf(" done!\n");

    initTime = ((float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC));    
    clk = Abc_Clock();

    topOrder1 = findTopologicalOrder(pNtk1);
    topOrder2 = findTopologicalOrder(pNtk2);

    printf("Refining IOs by simulation ...");                

    do
    {
        int counter = 0;
        int ioSuccess1, ioSuccess2;    
        
        do
        {
            for(i = 0; i < iLastItem1; i++)
            {
                int temp = (int)(SIM_RANDOM_UNSIGNED % 2);        
                
                if(Vec_IntSize(iMatch1[i]) != Vec_IntSize(iMatch2[i]))
                {
                    fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");                
                    goto freeAndExit;
                }
                
                for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
                {
                    vPiValues1[Vec_IntEntry(iMatch1[i], j)] = temp + '0';
                    vPiValues2[Vec_IntEntry(iMatch2[i], j)] = temp + '0';    
                }            
            }                    
            
            ioSuccess1 = refineIOBySimulation(pNtk1, iMatch1, &iLastItem1, iGroup1, iDep1, oMatch1, &oLastItem1, oGroup1, oDep1, vPiValues1, observability1, topOrder1);                
            ioSuccess2 = refineIOBySimulation(pNtk2, iMatch2, &iLastItem2, iGroup2, iDep2, oMatch2, &oLastItem2, oGroup2, oDep2, vPiValues2, observability2, topOrder2);
            
            if(ioSuccess1 && ioSuccess2)
                counter = 0;
            else
                counter++;                        
            
            if(ioSuccess1 != ioSuccess2 ||
               !checkListConsistency(iMatch1, oMatch1, iMatch2, oMatch2, iLastItem1, oLastItem1, iLastItem2, oLastItem2))
            {
                fprintf( stdout, "Input refinement by simulation finds two circuits different.\n");                
                goto freeAndExit;
            }
        }while(counter <= 200);                
        
    }while(0);    

    printf(" done!\n");
    
    simulTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);
    printf("SAT-based search started ...\n");

    satTime = refineBySAT(pNtk1, iMatch1, iGroup1, iDep1, &iLastItem1, oMatch1, oGroup1, oDep1, &oLastItem1, observability1,
                                  pNtk2, iMatch2, iGroup2, iDep2, &iLastItem2, oMatch2, oGroup2, oDep2, &oLastItem2, observability2);

    printf( "Init Time = %4.2f\n", initTime );    
    printf( "Simulation Time = %4.2f\n", simulTime );
    printf( "SAT Time = %4.2f\n", satTime );
    printf( "Overall Time = %4.2f\n", initTime + simulTime + satTime );
    
freeAndExit:

    for(i = 0; i < iLastItem1 ; i++)
    {            
        
        Vec_IntFree( iMatch1[i] );
        Vec_IntFree( iMatch2[i] );
    }
    
    for(i = 0; i < oLastItem1 ; i++)
    {            
        
        Vec_IntFree( oMatch1[i] );
        Vec_IntFree( oMatch2[i] );
    }

    for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
    {
        Vec_IntFree( iDep1[i] );
        Vec_IntFree( iDep2[i] );
        if(topOrder1 != NULL) {
            Vec_PtrFree( topOrder1[i] );
            Vec_PtrFree( topOrder2[i] );
        }
    }

    for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)
    {
        Vec_IntFree( oDep1[i] );
        Vec_IntFree( oDep2[i] );
    }

    ABC_FREE( iMatch1 );
    ABC_FREE( iMatch2 );
    ABC_FREE( oMatch1 );
    ABC_FREE( oMatch2 );
    ABC_FREE( iDep1 );
    ABC_FREE( iDep2 );
    ABC_FREE( oDep1 );
    ABC_FREE( oDep2 );
    ABC_FREE( iGroup1 );
    ABC_FREE( iGroup2 );
    ABC_FREE( oGroup1 );
    ABC_FREE( oGroup2 );    
    ABC_FREE( vPiValues1 );
    ABC_FREE( vPiValues2 );
    ABC_FREE( observability1 );
    ABC_FREE( observability2 );
    if(topOrder1 != NULL) {
        ABC_FREE( topOrder1 );
        ABC_FREE( topOrder2 );
    }
}